

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval_heap.hpp
# Opt level: O3

void boost::heap::interval_heap_internal::
     sift_down<false,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,std::less<int>>
               (long first,long last,long origin)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  uVar2 = *(undefined4 *)(first + origin * 4);
  lVar5 = last - first >> 2;
  lVar6 = lVar5 - (last - first >> 0x3f) >> 1;
  lVar1 = lVar6 + -1;
  lVar7 = origin;
  if (origin < lVar1) {
    do {
      if (*(int *)(first + 4 + lVar7 * 8) < *(int *)(first + 0xc + lVar7 * 8)) {
        origin = lVar7 * 2 + 3;
      }
      else {
        origin = lVar7 * 2 + 1;
      }
      *(undefined4 *)(first + lVar7 * 4) = *(undefined4 *)(first + origin * 4);
      lVar7 = origin;
    } while (origin < lVar1);
  }
  if ((origin <= lVar6) && (lVar1 = origin * 2 + 1, lVar1 < lVar5)) {
    lVar7 = origin * 2 + 2;
    if (lVar7 == lVar5) {
      iVar4 = *(int *)(first + lVar1 * 4);
    }
    else {
      iVar4 = *(int *)(first + lVar1 * 4);
      iVar3 = *(int *)(first + 8 + origin * 8);
      if (iVar4 < iVar3) {
        *(int *)(first + origin * 4) = iVar3;
        *(undefined4 *)(first + 8 + origin * 8) = uVar2;
        sift_leaf_min<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,std::less<int>>
                  (first,last,lVar7);
        return;
      }
    }
    *(int *)(first + origin * 4) = iVar4;
    origin = lVar1;
  }
  *(undefined4 *)(first + origin * 4) = uVar2;
  sift_leaf_max<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,std::less<int>>
            (first,last,origin);
  return;
}

Assistant:

void sift_down (Iterator first, Iterator last, Offset origin, Compare compare,
                Offset limit_child)
{
//  Use the most specialized available functions.
  using namespace std;

//  By keeping track of where I started, I can roll back all changes.
  Offset index = origin;
#if (__cplusplus >= 201103L)  //  C++11
  typedef typename iterator_traits<Iterator>::value_type Value;
  Value limbo = std::move_if_noexcept(*(first + index));
#endif

  const Offset index_end = last - first;
//  One past the last element with two children.
  const Offset end_parent = index_end / 2 -
                              ((left_bound && ((index_end & 3) == 0)) ? 2 : 1);
  try { //  This try-catch block rolls back after exceptions.
    while (index < end_parent) {
      Offset child = index * 2 + (left_bound ? 2 : 1);
//  If compare throws, heap property cannot be verified or enforced.
      try { //  This try-catch block ensures no element is left in limbo.
        if (compare(*(first + child + (left_bound ? 2 : 0)),
                    *(first + child + (left_bound ? 0 : 2))))
          child += 2;
      } catch (...) {
#if (__cplusplus >= 201103L)  //  C++11
//  Pull the moving element out of limbo, to avoid leaks.
        *(first + index) = std::move_if_noexcept(limbo);
#endif
        throw;  //  Re-throw the current exception.
      }
#if (__cplusplus >= 201103L)  //  C++11
      *(first + index) = std::move_if_noexcept(*(first + child));
#else
      swap(*(first + index), *(first + child));
#endif
      index = child;
    }
//  Special case when index has exactly one child.
    if (index <= end_parent + (left_bound ? 0 : 1)) {
      Offset child = index * 2 + (left_bound ? 2 : 1);
      if (child < index_end) {
        const Offset cochild = child + 1;
//  Need to treat singletons (child + 1) as both upper and lower bounds.
        if (!left_bound && (cochild != index_end)) {
//  Calculating this outside the if-statement simplifies exception-handling.
          bool swap_required;
          try {
            swap_required = compare(*(first + child), *(first + cochild));
          } catch (...) {
//  Pull the moving element out of limbo.
#if (__cplusplus >= 201103L)
            *(first + index) = std::move_if_noexcept(limbo);
#endif
            throw;  //  Re-throw the current exception.
          }
          if (swap_required) {
            //++child;
#if (__cplusplus >= 201103L)  //  C++11
            *(first + index) = std::move_if_noexcept(*(first + cochild));
            *(first + cochild) = std::move_if_noexcept(limbo);
#else
            swap(*(first + index), *(first + cochild));
#endif
            index = cochild;  //  Important for the rollback.
            sift_leaf_min<Iterator, Offset, Compare>(first, last, index,
                                                     compare, limit_child);
            return;
          }
        }
#if (__cplusplus >= 201103L)  //  C++11
        *(first + index) = std::move_if_noexcept(*(first + child));
#else
        swap(*(first + index), *(first + child));
#endif
        index = child;
      }
    }
//  Pull the moving element out of limbo.
#if (__cplusplus >= 201103L)  //  C++11
    *(first + index) = std::move_if_noexcept(limbo);
#endif
    if (left_bound)
      sift_leaf_min<Iterator, Offset, Compare>(first, last, index, compare,
                                               limit_child);
    else
      sift_leaf_max<Iterator, Offset, Compare>(first, last, index, compare,
                                               limit_child);
  } catch (...) {
//  Rolls back comparison exceptions. Move exceptions can't be reliably fixed.
    while (index > origin) {
      const Offset parent = ((index / 2 - 1) | 1) ^ (left_bound ? 1 : 0);
      swap(*(first + parent), *(first + index));
      index = parent;
    }
    throw;  //  Re-throw the current exception.
  }
}